

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddNotDefinedError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          string *undefined_symbol)

{
  ErrorLocation EVar1;
  Message *pMVar2;
  Message *pMVar3;
  ulong uVar4;
  string *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  string *undefined_symbol_local;
  Message *pMStack_20;
  ErrorLocation location_local;
  Message *descriptor_local;
  string *element_name_local;
  DescriptorBuilder *this_local;
  
  local_30 = undefined_symbol;
  undefined_symbol_local._4_4_ = location;
  pMStack_20 = descriptor;
  descriptor_local = (Message *)element_name;
  element_name_local = (string *)this;
  if ((this->possible_undeclared_dependency_ == (FileDescriptor *)0x0) &&
     (uVar4 = std::__cxx11::string::empty(), pMVar3 = descriptor_local, pMVar2 = pMStack_20,
     EVar1 = undefined_symbol_local._4_4_, (uVar4 & 1) != 0)) {
    std::operator+(&local_70,"\"",local_30);
    std::operator+(&local_50,&local_70,"\" is not defined.");
    AddError(this,(string *)pMVar3,pMVar2,EVar1,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  else {
    pMVar3 = descriptor_local;
    pMVar2 = pMStack_20;
    EVar1 = undefined_symbol_local._4_4_;
    if (this->possible_undeclared_dependency_ != (FileDescriptor *)0x0) {
      std::operator+(&local_140,"\"",&this->possible_undeclared_dependency_name_);
      std::operator+(&local_120,&local_140,"\" seems to be defined in \"");
      __rhs = FileDescriptor::name_abi_cxx11_(this->possible_undeclared_dependency_);
      std::operator+(&local_100,&local_120,__rhs);
      std::operator+(&local_e0,&local_100,"\", which is not imported by \"");
      std::operator+(&local_c0,&local_e0,&this->filename_);
      std::operator+(&local_a0,&local_c0,"\".  To use it here, please add the necessary import.");
      AddError(this,(string *)pMVar3,pMVar2,EVar1,&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_140);
    }
    uVar4 = std::__cxx11::string::empty();
    pMVar3 = descriptor_local;
    pMVar2 = pMStack_20;
    EVar1 = undefined_symbol_local._4_4_;
    if ((uVar4 & 1) == 0) {
      std::operator+(&local_200,"\"",local_30);
      std::operator+(&local_1e0,&local_200,"\" is resolved to \"");
      std::operator+(&local_1c0,&local_1e0,&this->undefine_resolved_name_);
      std::operator+(&local_1a0,&local_1c0,
                     "\", which is not defined. The innermost scope is searched first in name resolution. Consider using a leading \'.\'(i.e., \"."
                    );
      std::operator+(&local_180,&local_1a0,local_30);
      std::operator+(&local_160,&local_180,"\") to start from the outermost scope.");
      AddError(this,(string *)pMVar3,pMVar2,EVar1,&local_160);
      std::__cxx11::string::~string((string *)&local_160);
      std::__cxx11::string::~string((string *)&local_180);
      std::__cxx11::string::~string((string *)&local_1a0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::__cxx11::string::~string((string *)&local_1e0);
      std::__cxx11::string::~string((string *)&local_200);
    }
  }
  return;
}

Assistant:

void DescriptorBuilder::AddNotDefinedError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location,
    const std::string& undefined_symbol) {
  if (possible_undeclared_dependency_ == nullptr &&
      undefine_resolved_name_.empty()) {
    AddError(element_name, descriptor, location,
             "\"" + undefined_symbol + "\" is not defined.");
  } else {
    if (possible_undeclared_dependency_ != nullptr) {
      AddError(element_name, descriptor, location,
               "\"" + possible_undeclared_dependency_name_ +
                   "\" seems to be defined in \"" +
                   possible_undeclared_dependency_->name() +
                   "\", which is not "
                   "imported by \"" +
                   filename_ +
                   "\".  To use it here, please "
                   "add the necessary import.");
    }
    if (!undefine_resolved_name_.empty()) {
      AddError(element_name, descriptor, location,
               "\"" + undefined_symbol + "\" is resolved to \"" +
                   undefine_resolved_name_ +
                   "\", which is not defined. "
                   "The innermost scope is searched first in name resolution. "
                   "Consider using a leading '.'(i.e., \"." +
                   undefined_symbol + "\") to start from the outermost scope.");
    }
  }
}